

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dupstr.c
# Opt level: O2

char * dupstr(char *s)

{
  size_t sVar1;
  char *pcVar2;
  
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    pcVar2 = (char *)safemalloc((long)((int)sVar1 + 1),1,0);
    pcVar2 = strcpy(pcVar2,s);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char *dupstr(const char *s)
{
    char *p = NULL;
    if (s) {
        int len = strlen(s);
        p = snewn(len + 1, char);
        strcpy(p, s);
    }
    return p;
}